

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O2

int32_t ulocimp_forLanguageTag_63
                  (char *langtag,int32_t tagLen,char *localeID,int32_t localeIDCapacity,
                  int32_t *parsedLength,UErrorCode *status)

{
  AttributeListEntry *pAVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  UBool UVar6;
  ushort uVar7;
  int32_t size;
  int iVar8;
  int32_t iVar9;
  int iVar10;
  UErrorCode UVar11;
  size_t sVar12;
  char *pcVar13;
  ULanguageTag *langtag_00;
  char *pcVar14;
  size_t __n;
  VariantListEntry *pVVar15;
  VariantListEntry **ppVVar16;
  char *pcVar17;
  ExtensionListEntry **ppEVar18;
  ExtensionListEntry *pEVar19;
  AttributeListEntry *pAVar20;
  char *pcVar21;
  char *pcVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  char *pcVar26;
  int iVar27;
  ExtensionListEntry **ppEVar28;
  char *str;
  ExtensionListEntry *pEVar29;
  AttributeListEntry *pAVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  bool bVar34;
  char *local_1b0;
  int local_1a8;
  ulong local_1a0;
  int local_188;
  char *local_180;
  UBool firstValue;
  char *local_170;
  ExtensionListEntry *local_168;
  ExtensionListEntry *local_150;
  AttributeListEntry *attrFirst;
  ExtensionListEntry *kwdFirst;
  char bcpKeyBuf [9];
  char local_118 [128];
  char attrBuf [100];
  
  if (parsedLength != (int32_t *)0x0) {
    *parsedLength = 0;
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (tagLen < 0) {
    sVar12 = strlen(langtag);
    tagLen = (int32_t)sVar12;
  }
  pcVar13 = (char *)uprv_malloc_63((long)(int)(tagLen + 1U));
  if (pcVar13 == (char *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return 0;
  }
  memcpy(pcVar13,langtag,(long)tagLen);
  pcVar13[tagLen] = '\0';
  langtag_00 = (ULanguageTag *)uprv_malloc_63(0x58);
  if (langtag_00 == (ULanguageTag *)0x0) {
    uprv_free_63(pcVar13);
    *status = U_MEMORY_ALLOCATION_ERROR;
    return 0;
  }
  langtag_00->language = "";
  for (lVar24 = 2; lVar24 != 5; lVar24 = lVar24 + 1) {
    langtag_00->extlang[lVar24 + -2] = (char *)0x0;
  }
  langtag_00->script = "";
  langtag_00->region = "";
  langtag_00->variants = (VariantListEntry *)0x0;
  langtag_00->extensions = (ExtensionListEntry *)0x0;
  langtag_00->grandfathered = "";
  langtag_00->privateuse = "";
  langtag_00->buf = pcVar13;
  if (1 < tagLen) {
    for (uVar25 = 0; uVar25 < 0x34; uVar25 = uVar25 + 2) {
      iVar8 = uprv_stricmp_63(GRANDFATHERED[uVar25],pcVar13);
      if (iVar8 == 0) {
        pcVar17 = GRANDFATHERED[uVar25 + 1];
        sVar12 = strlen(pcVar17);
        if (tagLen < (int)sVar12) {
          uprv_free_63(pcVar13);
          pcVar14 = (char *)uprv_malloc_63((ulong)((int)sVar12 + 1));
          if (pcVar14 == (char *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            goto LAB_002cd47a;
          }
          langtag_00->buf = pcVar14;
          pcVar13 = pcVar14;
        }
        else {
          pcVar14 = langtag_00->buf;
        }
        strcpy(pcVar14,pcVar17);
        iVar8 = tagLen;
        goto LAB_002cceed;
      }
    }
    local_1a8 = 0;
    iVar8 = local_1a8;
    local_1a8 = 0;
    for (uVar25 = 0; uVar25 < 0x34; uVar25 = uVar25 + 2) {
      pcVar17 = REDUNDANT[uVar25];
      sVar12 = strlen(pcVar17);
      iVar10 = uprv_strnicmp_63(pcVar17,pcVar13,(uint32_t)sVar12);
      if ((iVar10 == 0) && ((pcVar13[sVar12] == '-' || (pcVar13[sVar12] == '\0')))) {
        pcVar17 = REDUNDANT[uVar25 + 1];
        __n = strlen(pcVar17);
        strncpy(langtag_00->buf,pcVar17,__n);
        if (pcVar13[sVar12] == '-') {
          memmove(pcVar13 + __n,pcVar13 + sVar12,(tagLen + 1U) - sVar12);
        }
        else {
          pcVar13[__n] = '\0';
        }
        local_188 = (uint32_t)sVar12 - (int)__n;
        goto LAB_002ccf47;
      }
    }
LAB_002cceed:
    local_1a8 = iVar8;
    local_188 = 0;
LAB_002ccf47:
    ppEVar28 = &langtag_00->extensions;
    uVar7 = 0x81;
    local_168 = (ExtensionListEntry *)0x0;
    local_1b0 = (char *)0x0;
    local_180 = (char *)0x0;
    bVar34 = false;
    pcVar17 = pcVar13;
    iVar8 = 0;
LAB_002ccf87:
    while( true ) {
      pcVar26 = pcVar17;
      pcVar14 = pcVar26;
      if (pcVar13 == (char *)0x0) goto LAB_002cd49e;
      iVar10 = 0;
      for (pcVar21 = pcVar13; (cVar5 = *pcVar21, cVar5 != '\0' && (cVar5 != '-'));
          pcVar21 = pcVar21 + 1) {
        iVar10 = iVar10 + 1;
      }
      pcVar22 = pcVar21 + 1;
      str = (char *)0x0;
      if (cVar5 != '\0') {
        str = pcVar22;
      }
      pcVar17 = pcVar21;
      if (((uVar7 & 1) == 0) || (UVar6 = _isLanguageSubtag(pcVar13,iVar10), UVar6 == '\0')) break;
      *pcVar21 = '\0';
      pcVar13 = T_CString_toLowerCase_63(pcVar13);
      langtag_00->language = pcVar13;
      uVar7 = (ushort)(iVar10 < 4) * 2 + 0xbc;
      pcVar13 = str;
    }
    if ((uVar7 & 2) != 0) {
      iVar27 = iVar10;
      if (iVar10 < 0) {
        sVar12 = strlen(pcVar13);
        iVar27 = (int)sVar12;
      }
      if ((iVar27 == 3) && (UVar6 = _isAlphaString(pcVar13,3), UVar6 != '\0')) {
        *pcVar21 = '\0';
        pcVar13 = T_CString_toLowerCase_63(pcVar13);
        langtag_00->extlang[iVar8] = pcVar13;
        uVar7 = (ushort)(iVar8 < 2) * 2 + 0xbc;
        pcVar13 = str;
        iVar8 = iVar8 + 1;
        goto LAB_002ccf87;
      }
    }
    if (((uVar7 & 4) != 0) && (UVar6 = _isScriptSubtag(pcVar13,iVar10), UVar6 != '\0')) {
      *pcVar21 = '\0';
      cVar5 = uprv_toupper_63(*pcVar13);
      *pcVar13 = cVar5;
      pcVar14 = pcVar13;
      while( true ) {
        pcVar14 = pcVar14 + 1;
        if (*pcVar14 == '\0') break;
        cVar5 = uprv_asciitolower_63(*pcVar14);
        *pcVar14 = cVar5;
      }
      langtag_00->script = pcVar13;
      uVar7 = 0xb8;
      pcVar13 = str;
      goto LAB_002ccf87;
    }
    if (((uVar7 & 8) != 0) && (UVar6 = _isRegionSubtag(pcVar13,iVar10), UVar6 != '\0')) {
      *pcVar21 = '\0';
      pcVar13 = T_CString_toUpperCase_63(pcVar13);
      langtag_00->region = pcVar13;
      uVar7 = 0xb0;
      pcVar13 = str;
      goto LAB_002ccf87;
    }
    if ((uVar7 & 0x10) == 0) {
LAB_002cd133:
      pcVar17 = pcVar26;
      if (((uVar7 & 0x20) == 0) || (UVar6 = _isExtensionSingleton(pcVar13,iVar10), UVar6 == '\0')) {
        if (((uVar7 & 0x40) == 0) || (UVar6 = _isExtensionSubtag(pcVar13,iVar10), UVar6 == '\0')) {
          if ((uVar7 < 0x80) ||
             ((cVar4 = uprv_asciitolower_63(*pcVar13), iVar10 != 1 || (cVar4 != 'x'))))
          goto LAB_002cd49e;
          if (local_168 != (ExtensionListEntry *)0x0) {
            if ((local_1b0 != (char *)0x0) && (local_180 != (char *)0x0)) {
              *local_180 = '\0';
              pcVar13 = T_CString_toLowerCase_63(local_1b0);
              local_168->value = pcVar13;
              UVar6 = _addExtensionToList(ppEVar28,local_168,'\0');
              pcVar14 = local_180;
              if (UVar6 != '\0') goto LAB_002cd334;
            }
            uprv_free_63(local_168);
            pcVar14 = pcVar26;
            goto LAB_002cd532;
          }
LAB_002cd334:
          if (cVar5 == '\0') goto LAB_002cd532;
LAB_002cd342:
          pcVar17 = pcVar14;
          if (pcVar22 == (char *)0x0) goto LAB_002cd429;
          iVar10 = 0;
          for (pcVar14 = pcVar22; (cVar5 = *pcVar14, cVar5 != '\0' && (cVar5 != '-'));
              pcVar14 = pcVar14 + 1) {
            iVar10 = iVar10 + 1;
          }
          pcVar13 = (char *)0x0;
          if (cVar5 != '\0') {
            pcVar13 = pcVar14 + 1;
          }
          iVar27 = strncmp(pcVar22,"lvariant",8);
          if (iVar27 != 0) goto code_r0x002cd38e;
          *pcVar14 = '\0';
          uVar7 = 0x10;
          bVar34 = true;
          local_168 = (ExtensionListEntry *)0x0;
        }
        else {
          if (local_1b0 == (char *)0x0) {
            local_1b0 = pcVar13;
          }
          uVar7 = 0xe0;
          pcVar13 = str;
          local_180 = pcVar21;
        }
      }
      else {
        if (local_168 != (ExtensionListEntry *)0x0) {
          if ((local_1b0 != (char *)0x0) && (local_180 != (char *)0x0)) {
            *local_180 = '\0';
            pcVar17 = T_CString_toLowerCase_63(local_1b0);
            local_168->value = pcVar17;
            UVar6 = _addExtensionToList(ppEVar28,local_168,'\0');
            pcVar17 = local_180;
            if (UVar6 != '\0') goto LAB_002cd3d5;
          }
          uprv_free_63(local_168);
          goto LAB_002cd532;
        }
LAB_002cd3d5:
        local_168 = (ExtensionListEntry *)uprv_malloc_63(0x18);
        if (local_168 == (ExtensionListEntry *)0x0) {
LAB_002cd469:
          *status = U_MEMORY_ALLOCATION_ERROR;
LAB_002cd47a:
          ultag_close(langtag_00);
          langtag_00 = (ULanguageTag *)0x0;
          goto LAB_002cd560;
        }
        *pcVar21 = '\0';
        pcVar13 = T_CString_toLowerCase_63(pcVar13);
        local_168->key = pcVar13;
        local_168->value = (char *)0x0;
        uVar7 = 0x40;
        local_1b0 = (char *)0x0;
        local_180 = (char *)0x0;
        pcVar13 = str;
      }
      goto LAB_002ccf87;
    }
    UVar6 = _isVariantSubtag(pcVar13,iVar10);
    if (UVar6 == '\0') {
      if (bVar34) {
        iVar27 = iVar10;
        if (iVar10 < 0) {
          sVar12 = strlen(pcVar13);
          iVar27 = (int)sVar12;
        }
        if ((iVar27 - 1U < 8) && (UVar6 = _isAlphaNumericString(pcVar13,iVar27), UVar6 != '\0'))
        goto LAB_002cd1d9;
      }
      goto LAB_002cd133;
    }
LAB_002cd1d9:
    pVVar15 = (VariantListEntry *)uprv_malloc_63(0x10);
    if (pVVar15 == (VariantListEntry *)0x0) goto LAB_002cd469;
    *pcVar21 = '\0';
    pcVar13 = T_CString_toUpperCase_63(pcVar13);
    pVVar15->variant = pcVar13;
    UVar6 = _addVariantToList(&langtag_00->variants,pVVar15);
    uVar7 = 0xb0;
    pcVar13 = str;
    if (UVar6 != '\0') goto LAB_002ccf87;
    uprv_free_63(pVVar15);
LAB_002cd49e:
    if (local_168 != (ExtensionListEntry *)0x0) {
      if (local_180 != (char *)0x0 && local_1b0 != (char *)0x0) {
        *local_180 = '\0';
        pcVar13 = T_CString_toLowerCase_63(local_1b0);
        local_168->value = pcVar13;
        UVar6 = _addExtensionToList(ppEVar28,local_168,'\0');
        pcVar14 = local_180;
        if (UVar6 != '\0') goto LAB_002cd532;
      }
      uprv_free_63(local_168);
      pcVar14 = pcVar26;
    }
LAB_002cd532:
    if (parsedLength != (int32_t *)0x0) {
      if (local_1a8 < 1) {
        local_1a8 = (local_188 + (int)pcVar14) - *(int *)&langtag_00->buf;
      }
      *parsedLength = local_1a8;
    }
  }
LAB_002cd560:
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  iVar8 = 0;
  for (lVar24 = 2; lVar24 != 5; lVar24 = lVar24 + 1) {
    iVar8 = (iVar8 + 1) - (uint)(langtag_00->extlang[lVar24 + -2] == (char *)0x0);
  }
  pcVar13 = langtag_00->extlang[(ulong)(iVar8 != 0) - 1];
  iVar8 = strcmp(pcVar13,"und");
  uVar25 = 0;
  if (iVar8 != 0) {
    sVar12 = strlen(pcVar13);
    if (0 < (int)sVar12) {
      if (0 < localeIDCapacity) {
        iVar9 = uprv_min_63((int)sVar12,localeIDCapacity);
        memcpy(localeID,pcVar13,(long)iVar9);
      }
      uVar25 = sVar12 & 0xffffffff;
    }
  }
  pcVar13 = langtag_00->script;
  sVar12 = strlen(pcVar13);
  if (0 < (int)sVar12) {
    iVar8 = (int)uVar25;
    if (iVar8 < localeIDCapacity) {
      localeID[uVar25] = '_';
    }
    lVar24 = 0;
    while( true ) {
      cVar5 = pcVar13[lVar24];
      if (cVar5 == '\0') break;
      if (iVar8 + 1 + (int)lVar24 < localeIDCapacity) {
        if (lVar24 == 0) {
          cVar5 = uprv_toupper_63(cVar5);
        }
        localeID[lVar24 + uVar25 + 1] = cVar5;
      }
      lVar24 = lVar24 + 1;
    }
    uVar25 = (ulong)((int)lVar24 + iVar8 + 1);
  }
  pcVar13 = langtag_00->region;
  sVar12 = strlen(pcVar13);
  if (0 < (int)sVar12) {
    iVar8 = (int)uVar25;
    if (iVar8 < localeIDCapacity) {
      localeID[uVar25] = '_';
    }
    lVar24 = 0;
    while( true ) {
      cVar5 = pcVar13[lVar24];
      if (cVar5 == '\0') break;
      if (iVar8 + 1 + (int)lVar24 < localeIDCapacity) {
        cVar5 = uprv_toupper_63(cVar5);
        localeID[lVar24 + uVar25 + 1] = cVar5;
      }
      lVar24 = lVar24 + 1;
    }
    uVar25 = (ulong)((int)lVar24 + iVar8 + 1);
  }
  iVar9 = ultag_getVariantsSize(langtag_00);
  if (0 < iVar9) {
    if ((int)sVar12 < 1) {
      if ((int)uVar25 < localeIDCapacity) {
        localeID[uVar25] = '_';
      }
      uVar25 = (ulong)((int)uVar25 + 1);
    }
    for (iVar8 = 0; ppVVar16 = &langtag_00->variants, iVar10 = iVar8, iVar8 != iVar9;
        iVar8 = iVar8 + 1) {
      while (pVVar15 = *ppVVar16, pVVar15 != (VariantListEntry *)0x0) {
        if (iVar10 == 0) {
          pcVar13 = pVVar15->variant;
          goto LAB_002cd72b;
        }
        iVar10 = iVar10 + -1;
        ppVVar16 = &pVVar15->next;
      }
      pcVar13 = (char *)0x0;
LAB_002cd72b:
      iVar10 = (int)uVar25;
      if (iVar10 < localeIDCapacity) {
        localeID[uVar25] = '_';
      }
      lVar24 = 0;
      while( true ) {
        if (pcVar13[lVar24] == '\0') break;
        if (iVar10 + 1 + (int)lVar24 < localeIDCapacity) {
          cVar5 = uprv_toupper_63(pcVar13[lVar24]);
          localeID[lVar24 + uVar25 + 1] = cVar5;
        }
        lVar24 = lVar24 + 1;
      }
      uVar25 = (ulong)(iVar10 + (int)lVar24 + 1);
    }
  }
  iVar9 = ultag_getExtensionsSize(langtag_00);
  if (iVar9 < 1) {
    if (*langtag_00->privateuse == '\0') goto LAB_002cd7ee;
  }
  else if (((int)uVar25 == 0) && (uVar25 = 3, 0 < localeIDCapacity)) {
    uVar25 = 3;
    iVar9 = uprv_min_63(3,localeIDCapacity);
    memcpy(localeID,"und",(long)iVar9);
  }
  local_150 = (ExtensionListEntry *)0x0;
  iVar9 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar8 = localeIDCapacity - (int)uVar25;
    pcVar13 = (char *)uprv_malloc_63((long)iVar8);
    if (pcVar13 != (char *)0x0) {
      pcVar17 = localeID + uVar25;
      iVar9 = ultag_getVariantsSize(langtag_00);
      bVar34 = iVar9 != 0;
      iVar10 = ultag_getExtensionsSize(langtag_00);
      ppEVar28 = &langtag_00->extensions;
      iVar27 = 0;
      if (iVar10 < 1) {
        iVar10 = 0;
      }
LAB_002cd880:
      ppEVar18 = ppEVar28;
      iVar23 = iVar27;
      if (iVar27 != iVar10) {
        while (pEVar19 = *ppEVar18, ppEVar18 = ppEVar28, iVar32 = iVar27,
              pEVar19 != (ExtensionListEntry *)0x0) {
          if (iVar23 == 0) {
            pcVar14 = pEVar19->key;
            goto LAB_002cd8b4;
          }
          iVar23 = iVar23 + -1;
          ppEVar18 = &pEVar19->next;
        }
        pcVar14 = (char *)0x0;
LAB_002cd8b4:
        do {
          pEVar19 = *ppEVar18;
          if (pEVar19 == (ExtensionListEntry *)0x0) goto LAB_002cd8c7;
          if (iVar32 == 0) {
            pcVar26 = pEVar19->value;
            goto LAB_002cd8cf;
          }
          ppEVar18 = &pEVar19->next;
          iVar32 = iVar32 + -1;
        } while( true );
      }
      UVar11 = *status;
      iVar10 = 0;
      if (UVar11 < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar14 = langtag_00->privateuse;
        sVar12 = strlen(pcVar14);
        if ((int)sVar12 < 1) {
LAB_002ce06f:
          if (((UVar11 < U_ILLEGAL_ARGUMENT_ERROR) && (iVar10 = 0, bVar34)) &&
             (iVar10 = 6, 0 < iVar8)) {
            iVar9 = uprv_min_63(6,iVar8);
            memcpy(pcVar17,"_POSIX",(long)iVar9);
            UVar11 = *status;
          }
        }
        else {
          pEVar19 = (ExtensionListEntry *)uprv_malloc_63(0x18);
          if (pEVar19 == (ExtensionListEntry *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
LAB_002ce0bd:
            UVar11 = U_MEMORY_ALLOCATION_ERROR;
LAB_002ce0d8:
            iVar10 = 0;
          }
          else {
            pEVar19->key = "x";
            pEVar19->value = pcVar14;
            UVar6 = _addExtensionToList(&local_150,pEVar19,'\0');
            if (UVar6 != '\0') {
              UVar11 = *status;
              goto LAB_002ce06f;
            }
            uprv_free_63(pEVar19);
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            UVar11 = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002ce0fe:
            iVar10 = 0;
          }
        }
      }
      pEVar19 = local_150;
      if (local_150 != (ExtensionListEntry *)0x0 && UVar11 < U_ILLEGAL_ARGUMENT_ERROR) {
        cVar5 = '\x01';
        pEVar29 = local_150;
        do {
          if (iVar10 < iVar8) {
            pcVar17[iVar10] = cVar5 * '\x05' + ';';
            cVar5 = '\0';
          }
          iVar10 = iVar10 + 1;
          pcVar14 = pEVar29->key;
          sVar12 = strlen(pcVar14);
          if (iVar8 - iVar10 != 0 && iVar10 <= iVar8) {
            iVar9 = uprv_min_63((int)sVar12,iVar8 - iVar10);
            memcpy(pcVar17 + iVar10,pcVar14,(long)iVar9);
          }
          iVar10 = iVar10 + (int)sVar12;
          if (iVar10 < iVar8) {
            pcVar17[iVar10] = '=';
          }
          iVar10 = iVar10 + 1;
          pcVar14 = pEVar29->value;
          sVar12 = strlen(pcVar14);
          if (iVar8 - iVar10 != 0 && iVar10 <= iVar8) {
            iVar9 = uprv_min_63((int)sVar12,iVar8 - iVar10);
            memcpy(pcVar17 + iVar10,pcVar14,(long)iVar9);
          }
          iVar10 = iVar10 + (int)sVar12;
          pEVar29 = pEVar29->next;
        } while (pEVar29 != (ExtensionListEntry *)0x0);
      }
      while (pEVar19 != (ExtensionListEntry *)0x0) {
        pEVar29 = pEVar19->next;
        uprv_free_63(pEVar19);
        pEVar19 = pEVar29;
      }
      uprv_free_63(pcVar13);
      iVar9 = 0;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar9 = u_terminateChars_63(pcVar17,iVar8,iVar10,status);
      }
      goto LAB_002cd7e3;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
LAB_002cd7e3:
  uVar25 = (ulong)(uint)(iVar9 + (int)uVar25);
LAB_002cd7ee:
  ultag_close(langtag_00);
  iVar9 = u_terminateChars_63(localeID,localeIDCapacity,(int32_t)uVar25,status);
  return iVar9;
code_r0x002cd38e:
  UVar6 = _isPrivateuseValueSubtag(pcVar22,iVar10);
  pcVar22 = pcVar13;
  if (UVar6 == '\0') {
LAB_002cd429:
    pcVar14 = pcVar17;
    if (0 < (long)pcVar17 - (long)str) {
      *pcVar17 = '\0';
      pcVar13 = T_CString_toLowerCase_63(str);
      langtag_00->privateuse = pcVar13;
    }
    goto LAB_002cd532;
  }
  goto LAB_002cd342;
LAB_002cd8c7:
  pcVar26 = (char *)0x0;
LAB_002cd8cf:
  if (*pcVar14 != 'u') {
    pEVar19 = (ExtensionListEntry *)uprv_malloc_63(0x18);
    if (pEVar19 == (ExtensionListEntry *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      goto LAB_002ce0bd;
    }
    pEVar19->key = pcVar14;
    pEVar19->value = pcVar26;
    UVar6 = _addExtensionToList(&local_150,pEVar19,'\0');
    if (UVar6 == '\0') {
      uprv_free_63(pEVar19);
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      UVar11 = U_ILLEGAL_ARGUMENT_ERROR;
      goto LAB_002ce0d8;
    }
    goto LAB_002cdfd5;
  }
  kwdFirst = (ExtensionListEntry *)0x0;
  attrFirst = (AttributeListEntry *)0x0;
  uVar31 = 0;
  while( true ) {
    cVar5 = *pcVar26;
    iVar23 = (int)uVar31;
    if (cVar5 == '\0') break;
    sVar12 = 0;
    while ((cVar5 != '\0' && (cVar5 != '-'))) {
      lVar24 = sVar12 + 1;
      sVar12 = sVar12 + 1;
      cVar5 = pcVar26[lVar24];
    }
    iVar32 = (int)sVar12;
    UVar6 = ultag_isUnicodeLocaleKey_63(pcVar26,iVar32);
    if (UVar6 != '\0') goto LAB_002cd9e7;
    pEVar19 = (ExtensionListEntry *)uprv_malloc_63(0x10);
    if (pEVar19 == (ExtensionListEntry *)0x0) goto LAB_002cda17;
    if (100 - iVar23 <= iVar32) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      goto LAB_002cda2f;
    }
    memcpy(attrBuf + uVar31,pcVar26,sVar12);
    attrBuf[(uint)(iVar32 + iVar23)] = '\0';
    pEVar19->key = attrBuf + uVar31;
    UVar6 = _addAttributeToList(&attrFirst,(AttributeListEntry *)pEVar19);
    if (UVar6 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      uprv_free_63(pEVar19);
      bVar3 = false;
      pAVar30 = attrFirst;
      goto LAB_002cda5d;
    }
    uVar31 = (ulong)(iVar23 + iVar32 + 1);
    pcVar26 = pcVar26 + ((sVar12 + 1) - (ulong)(pcVar26[sVar12] == '\0'));
  }
  pcVar26 = (char *)0x0;
LAB_002cd9e7:
  pAVar30 = attrFirst;
  if (attrFirst == (AttributeListEntry *)0x0) {
    uVar33 = 0;
LAB_002cdb7d:
    if (pcVar26 == (char *)0x0) {
      bVar3 = false;
      pEVar19 = kwdFirst;
LAB_002cdf96:
      while (bVar34 = bVar3, pEVar19 != (ExtensionListEntry *)0x0) {
        pEVar29 = pEVar19->next;
        _addExtensionToList(&local_150,pEVar19,'\0');
        pEVar19 = pEVar29;
      }
    }
    else {
      local_1b0 = (char *)0x0;
      bVar3 = false;
      local_180 = (char *)0x0;
      local_170 = (char *)0x0;
      local_1a0 = 0;
      bVar2 = false;
      do {
        pEVar19 = kwdFirst;
        if (bVar2) goto LAB_002cdf96;
        cVar5 = *pcVar26;
        iVar23 = (int)local_1a0;
        if (cVar5 == '\0') {
          bVar2 = true;
          uVar31 = 0;
          pcVar14 = (char *)0x0;
LAB_002cdc2d:
          iVar32 = (int)local_1b0;
          if (iVar32 < 9) {
            sVar12 = (size_t)iVar32;
            strncpy(bcpKeyBuf,local_180,sVar12);
            bcpKeyBuf[sVar12] = '\0';
            pcVar21 = uloc_toLegacyKey_63(bcpKeyBuf);
            if (pcVar21 == (char *)0x0) {
              *status = U_ILLEGAL_ARGUMENT_ERROR;
              iVar23 = 7;
            }
            else if (pcVar21 == bcpKeyBuf) {
              T_CString_toLowerCase_63(bcpKeyBuf);
              if (iVar32 <= (int)(~uVar33 + iVar8)) {
                pcVar21 = pcVar13 + (int)uVar33;
                memcpy(pcVar21,bcpKeyBuf,sVar12);
                pcVar13[(int)(uVar33 + iVar32)] = '\0';
                uVar33 = uVar33 + iVar32 + 1;
                goto LAB_002cdd6d;
              }
              *status = U_BUFFER_OVERFLOW_ERROR;
LAB_002cdf0a:
              iVar23 = 7;
            }
            else {
LAB_002cdd6d:
              if (local_170 == (char *)0x0) {
                pcVar22 = "yes";
                goto LAB_002cde39;
              }
              UVar11 = U_ILLEGAL_ARGUMENT_ERROR;
              if (iVar23 < 0x80) {
                sVar12 = (size_t)iVar23;
                strncpy(local_118,local_170,sVar12);
                local_118[sVar12] = '\0';
                pcVar22 = uloc_toLegacyType_63(pcVar21,local_118);
                UVar11 = U_ILLEGAL_ARGUMENT_ERROR;
                if (pcVar22 != (char *)0x0) {
                  if (pcVar22 == local_118) {
                    T_CString_toLowerCase_63(local_118);
                    UVar11 = U_BUFFER_OVERFLOW_ERROR;
                    if ((int)(~uVar33 + iVar8) < iVar23) goto LAB_002cde23;
                    pcVar22 = pcVar13 + (int)uVar33;
                    memcpy(pcVar22,local_118,sVar12);
                    pcVar13[(int)(uVar33 + iVar23)] = '\0';
                    uVar33 = uVar33 + iVar23 + 1;
                  }
LAB_002cde39:
                  if ((((bVar34) || (*pcVar21 != 'v')) || (pcVar21[1] != 'a')) ||
                     ((pcVar21[2] != '\0' || (iVar23 = strcmp(pcVar22,"posix"), iVar23 != 0)))) {
                    pEVar19 = (ExtensionListEntry *)uprv_malloc_63(0x18);
                    if (pEVar19 == (ExtensionListEntry *)0x0) {
                      *status = U_MEMORY_ALLOCATION_ERROR;
                      goto LAB_002cdf0a;
                    }
                    pEVar19->key = pcVar21;
                    pEVar19->value = pcVar22;
                    UVar6 = _addExtensionToList(&kwdFirst,pEVar19,'\0');
                    if (UVar6 == '\0') {
                      uprv_free_63(pEVar19);
                    }
                  }
                  else {
                    bVar3 = true;
                  }
                  local_170 = (char *)0x0;
                  local_1b0 = (char *)(uVar31 & 0xffffffff);
                  if (pcVar14 == (char *)0x0) {
                    local_1b0 = (char *)0x0;
                  }
                  local_1a0 = 0;
                  iVar23 = 0;
                  local_180 = pcVar14;
                  goto LAB_002cdf16;
                }
              }
LAB_002cde23:
              *status = UVar11;
              iVar23 = 7;
            }
          }
          else {
            *status = U_ILLEGAL_ARGUMENT_ERROR;
            iVar23 = 7;
          }
        }
        else {
          uVar31 = 0;
          while ((cVar5 != '\0' && (cVar5 != '-'))) {
            lVar24 = uVar31 + 1;
            uVar31 = uVar31 + 1;
            cVar5 = pcVar26[lVar24];
          }
          UVar6 = ultag_isUnicodeLocaleKey_63(pcVar26,(int)uVar31);
          if (UVar6 == '\0') {
            if (local_170 == (char *)0x0) {
              local_1a0 = uVar31 & 0xffffffff;
              local_170 = pcVar26;
            }
            else {
              local_1a0 = (ulong)(iVar23 + (int)uVar31 + 1);
            }
          }
          else {
            if (local_180 != (char *)0x0) {
              bVar2 = false;
              pcVar14 = pcVar26;
              pcVar26 = pcVar26 + ((uVar31 + 1) - (ulong)(pcVar26[uVar31] == '\0'));
              goto LAB_002cdc2d;
            }
            local_1b0 = (char *)(uVar31 & 0xffffffff);
            local_180 = pcVar26;
          }
          pcVar26 = pcVar26 + ((uVar31 + 1) - (ulong)(pcVar26[uVar31] == '\0'));
          bVar2 = false;
          iVar23 = 0;
        }
LAB_002cdf16:
      } while (iVar23 == 0);
      pAVar30 = attrFirst;
      bVar34 = bVar3;
      if (iVar23 == 7) goto LAB_002cda5d;
    }
  }
  else {
    if (iVar8 < iVar23) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      pEVar19 = (ExtensionListEntry *)uprv_malloc_63(0x18);
      if (pEVar19 == (ExtensionListEntry *)0x0) {
LAB_002cda17:
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        pEVar19->key = "attribute";
        pEVar19->value = pcVar13;
        iVar23 = 0;
        pAVar20 = pAVar30;
        while (pAVar20 != (AttributeListEntry *)0x0) {
          pAVar1 = pAVar20->next;
          if (pAVar20 != pAVar30) {
            pcVar13[iVar23] = '-';
            iVar23 = iVar23 + 1;
          }
          pcVar14 = pAVar20->attribute;
          sVar12 = strlen(pcVar14);
          memcpy(pcVar13 + iVar23,pcVar14,(long)(int)sVar12);
          iVar23 = (int)sVar12 + iVar23;
          pAVar20 = pAVar1;
        }
        pcVar13[iVar23] = '\0';
        UVar6 = _addExtensionToList(&kwdFirst,pEVar19,'\0');
        if (UVar6 != '\0') {
          uVar33 = iVar23 + 1;
          while (pAVar30 != (AttributeListEntry *)0x0) {
            pAVar20 = pAVar30->next;
            uprv_free_63(pAVar30);
            pAVar30 = pAVar20;
          }
          attrFirst = (AttributeListEntry *)0x0;
          goto LAB_002cdb7d;
        }
        *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002cda2f:
        uprv_free_63(pEVar19);
      }
    }
    bVar3 = false;
    pAVar30 = attrFirst;
LAB_002cda5d:
    while (pEVar19 = kwdFirst, pAVar30 != (AttributeListEntry *)0x0) {
      pAVar20 = pAVar30->next;
      uprv_free_63(pAVar30);
      pAVar30 = pAVar20;
    }
    while (bVar34 = bVar3, pEVar19 != (ExtensionListEntry *)0x0) {
      pEVar29 = pEVar19->next;
      uprv_free_63(pEVar19);
      pEVar19 = pEVar29;
    }
  }
  UVar11 = *status;
  if (U_ZERO_ERROR < UVar11) goto LAB_002ce0fe;
LAB_002cdfd5:
  iVar27 = iVar27 + 1;
  goto LAB_002cd880;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ulocimp_forLanguageTag(const char* langtag,
                       int32_t tagLen,
                       char* localeID,
                       int32_t localeIDCapacity,
                       int32_t* parsedLength,
                       UErrorCode* status) {
    ULanguageTag *lt;
    int32_t reslen = 0;
    const char *subtag, *p;
    int32_t len;
    int32_t i, n;
    UBool noRegion = TRUE;

    lt = ultag_parse(langtag, tagLen, parsedLength, status);
    if (U_FAILURE(*status)) {
        return 0;
    }

    /* language */
    subtag = ultag_getExtlangSize(lt) > 0 ? ultag_getExtlang(lt, 0) : ultag_getLanguage(lt);
    if (uprv_compareInvCharsAsAscii(subtag, LANG_UND) != 0) {
        len = (int32_t)uprv_strlen(subtag);
        if (len > 0) {
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID, subtag, uprv_min(len, localeIDCapacity - reslen));
            }
            reslen += len;
        }
    }

    /* script */
    subtag = ultag_getScript(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;

        /* write out the script in title case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                if (p == subtag) {
                    *(localeID + reslen) = uprv_toupper(*p);
                } else {
                    *(localeID + reslen) = *p;
                }
            }
            reslen++;
            p++;
        }
    }

    /* region */
    subtag = ultag_getRegion(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;
        /* write out the retion in upper case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = uprv_toupper(*p);
            }
            reslen++;
            p++;
        }
        noRegion = FALSE;
    }

    /* variants */
    n = ultag_getVariantsSize(lt);
    if (n > 0) {
        if (noRegion) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
        }

        for (i = 0; i < n; i++) {
            subtag = ultag_getVariant(lt, i);
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
            /* write out the variant in upper case */
            p = subtag;
            while (*p) {
                if (reslen < localeIDCapacity) {
                    *(localeID + reslen) = uprv_toupper(*p);
                }
                reslen++;
                p++;
            }
        }
    }

    /* keywords */
    n = ultag_getExtensionsSize(lt);
    subtag = ultag_getPrivateUse(lt);
    if (n > 0 || uprv_strlen(subtag) > 0) {
        if (reslen == 0 && n > 0) {
            /* need a language */
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID + reslen, LANG_UND, uprv_min(LANG_UND_LEN, localeIDCapacity - reslen));
            }
            reslen += LANG_UND_LEN;
        }
        len = _appendKeywords(lt, localeID + reslen, localeIDCapacity - reslen, status);
        reslen += len;
    }

    ultag_close(lt);
    return u_terminateChars(localeID, localeIDCapacity, reslen, status);
}